

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

BinaryOperator slang::ast::Expression::getBinaryOperator(SyntaxKind kind)

{
  BinaryOperator BVar1;
  logic_error *this;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((int)kind < 0xfc) {
    if (0x38 < (int)kind) {
      if ((int)kind < 0xad) {
        if ((int)kind < 0x90) {
          if (kind == CaseEqualityExpression) {
            return CaseEquality;
          }
          if (kind == CaseInequalityExpression) {
            return CaseInequality;
          }
        }
        else if ((kind == DivideAssignmentExpression) || (kind == DivideExpression)) {
          return Divide;
        }
      }
      else if ((int)kind < 0xd3) {
        if (kind == EqualityExpression) {
          return Equality;
        }
        if (kind == GreaterThanEqualExpression) {
          return GreaterThanEqual;
        }
      }
      else {
        if (kind == GreaterThanExpression) {
          return GreaterThan;
        }
        if (kind == InequalityExpression) {
          return Inequality;
        }
      }
      goto switchD_003a96bc_caseD_fe;
    }
    switch(kind) {
    case AddAssignmentExpression:
    case AddExpression:
      BVar1 = Add;
      break;
    case AlwaysBlock:
    case AlwaysCombBlock:
    case AlwaysFFBlock:
    case AlwaysLatchBlock:
    case AndPropertyExpr:
    case AndSequenceExpr:
    case AnsiPortList:
    case AnsiUdpPortList:
    case ArgumentList:
      goto switchD_003a96bc_caseD_fe;
    case AndAssignmentExpression:
switchD_003a96e7_caseD_c:
      BVar1 = BinaryAnd;
      break;
    case ArithmeticLeftShiftAssignmentExpression:
    case ArithmeticShiftLeftExpression:
      BVar1 = ArithmeticShiftLeft;
      break;
    case ArithmeticRightShiftAssignmentExpression:
    case ArithmeticShiftRightExpression:
      BVar1 = ArithmeticShiftRight;
      break;
    default:
      switch(kind) {
      case BinaryAndExpression:
        goto switchD_003a96e7_caseD_c;
      default:
        goto switchD_003a96bc_caseD_fe;
      case BinaryOrExpression:
        return BinaryOr;
      case BinaryXnorExpression:
        return BinaryXnor;
      case BinaryXorExpression:
        goto switchD_003a977e_caseD_2e;
      }
    }
  }
  else {
    if ((int)kind < 0x125) {
      switch(kind) {
      case LessThanEqualExpression:
        return LessThanEqual;
      case LessThanExpression:
        return LessThan;
      case LogicalAndExpression:
        return LogicalAnd;
      case LogicalEquivalenceExpression:
        return LogicalEquivalence;
      case LogicalImplicationExpression:
        return LogicalImplication;
      case LogicalLeftShiftAssignmentExpression:
      case LogicalShiftLeftExpression:
        return LogicalShiftLeft;
      case LogicalOrExpression:
        return LogicalOr;
      case LogicalRightShiftAssignmentExpression:
      case LogicalShiftRightExpression:
        return LogicalShiftRight;
      case ModAssignmentExpression:
      case ModExpression:
        return Mod;
      }
switchD_003a96bc_caseD_fe:
      this = (logic_error *)__cxa_allocate_exception(0x10);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
                 ,"");
      plVar2 = (long *)std::__cxx11::string::append((char *)local_90);
      local_d0._M_dataplus._M_p = (pointer)*plVar2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar3) {
        local_d0.field_2._M_allocated_capacity = *psVar3;
        local_d0.field_2._8_8_ = plVar2[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar3;
      }
      local_d0._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::to_string(&local_70,0x813);
      std::operator+(&local_50,&local_d0,&local_70);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_b0 = (long *)*plVar2;
      plVar4 = plVar2 + 2;
      if (local_b0 == plVar4) {
        local_a0 = *plVar4;
        lStack_98 = plVar2[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar4;
      }
      local_a8 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_f0 = (long *)*plVar2;
      plVar4 = plVar2 + 2;
      if (local_f0 == plVar4) {
        local_e0 = *plVar4;
        lStack_d8 = plVar2[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar4;
      }
      local_e8 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::logic_error::logic_error(this,(string *)&local_f0);
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    if ((int)kind < 0x1ae) {
      if ((int)kind < 0x13f) {
        if ((kind == MultiplyAssignmentExpression) || (kind == MultiplyExpression)) {
          return Multiply;
        }
      }
      else {
        if (kind == OrAssignmentExpression) {
          return BinaryOr;
        }
        if (kind == PowerExpression) {
          return Power;
        }
      }
      goto switchD_003a96bc_caseD_fe;
    }
    if ((int)kind < 499) {
      if ((kind == SubtractAssignmentExpression) || (kind == SubtractExpression)) {
        return Subtract;
      }
      goto switchD_003a96bc_caseD_fe;
    }
    if (kind == WildcardEqualityExpression) {
      return WildcardEquality;
    }
    if (kind == WildcardInequalityExpression) {
      return WildcardInequality;
    }
    if (kind != XorAssignmentExpression) goto switchD_003a96bc_caseD_fe;
switchD_003a977e_caseD_2e:
    BVar1 = BinaryXor;
  }
  return BVar1;
}

Assistant:

BinaryOperator Expression::getBinaryOperator(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AddExpression:
            return BinaryOperator::Add;
        case SyntaxKind::SubtractExpression:
            return BinaryOperator::Subtract;
        case SyntaxKind::MultiplyExpression:
            return BinaryOperator::Multiply;
        case SyntaxKind::DivideExpression:
            return BinaryOperator::Divide;
        case SyntaxKind::ModExpression:
            return BinaryOperator::Mod;
        case SyntaxKind::BinaryAndExpression:
            return BinaryOperator::BinaryAnd;
        case SyntaxKind::BinaryOrExpression:
            return BinaryOperator::BinaryOr;
        case SyntaxKind::BinaryXorExpression:
            return BinaryOperator::BinaryXor;
        case SyntaxKind::BinaryXnorExpression:
            return BinaryOperator::BinaryXnor;
        case SyntaxKind::EqualityExpression:
            return BinaryOperator::Equality;
        case SyntaxKind::InequalityExpression:
            return BinaryOperator::Inequality;
        case SyntaxKind::CaseEqualityExpression:
            return BinaryOperator::CaseEquality;
        case SyntaxKind::CaseInequalityExpression:
            return BinaryOperator::CaseInequality;
        case SyntaxKind::GreaterThanEqualExpression:
            return BinaryOperator::GreaterThanEqual;
        case SyntaxKind::GreaterThanExpression:
            return BinaryOperator::GreaterThan;
        case SyntaxKind::LessThanEqualExpression:
            return BinaryOperator::LessThanEqual;
        case SyntaxKind::LessThanExpression:
            return BinaryOperator::LessThan;
        case SyntaxKind::WildcardEqualityExpression:
            return BinaryOperator::WildcardEquality;
        case SyntaxKind::WildcardInequalityExpression:
            return BinaryOperator::WildcardInequality;
        case SyntaxKind::LogicalAndExpression:
            return BinaryOperator::LogicalAnd;
        case SyntaxKind::LogicalOrExpression:
            return BinaryOperator::LogicalOr;
        case SyntaxKind::LogicalImplicationExpression:
            return BinaryOperator::LogicalImplication;
        case SyntaxKind::LogicalEquivalenceExpression:
            return BinaryOperator::LogicalEquivalence;
        case SyntaxKind::LogicalShiftLeftExpression:
            return BinaryOperator::LogicalShiftLeft;
        case SyntaxKind::LogicalShiftRightExpression:
            return BinaryOperator::LogicalShiftRight;
        case SyntaxKind::ArithmeticShiftLeftExpression:
            return BinaryOperator::ArithmeticShiftLeft;
        case SyntaxKind::ArithmeticShiftRightExpression:
            return BinaryOperator::ArithmeticShiftRight;
        case SyntaxKind::PowerExpression:
            return BinaryOperator::Power;
        case SyntaxKind::AddAssignmentExpression:
            return BinaryOperator::Add;
        case SyntaxKind::SubtractAssignmentExpression:
            return BinaryOperator::Subtract;
        case SyntaxKind::MultiplyAssignmentExpression:
            return BinaryOperator::Multiply;
        case SyntaxKind::DivideAssignmentExpression:
            return BinaryOperator::Divide;
        case SyntaxKind::ModAssignmentExpression:
            return BinaryOperator::Mod;
        case SyntaxKind::AndAssignmentExpression:
            return BinaryOperator::BinaryAnd;
        case SyntaxKind::OrAssignmentExpression:
            return BinaryOperator::BinaryOr;
        case SyntaxKind::XorAssignmentExpression:
            return BinaryOperator::BinaryXor;
        case SyntaxKind::LogicalLeftShiftAssignmentExpression:
            return BinaryOperator::LogicalShiftLeft;
        case SyntaxKind::LogicalRightShiftAssignmentExpression:
            return BinaryOperator::LogicalShiftRight;
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression:
            return BinaryOperator::ArithmeticShiftLeft;
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression:
            return BinaryOperator::ArithmeticShiftRight;
        default:
            ASSUME_UNREACHABLE;
    }
}